

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,IVec4 *coordBits,
              LodPrecision *lodPrec,qpWatchDog *watchDog)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ReferenceParams *pRVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float afVar45 [4];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  TextureCubeArrayView TVar78;
  Vec3 triS [2];
  Vector<float,_2> res_2;
  Vec2 clampedLod;
  Vec4 resPix;
  Vec3 triQ [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec2 lodBounds;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodO;
  TextureCubeArrayView src;
  undefined1 local_498 [32];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [4];
  float local_454;
  undefined8 local_450;
  float local_448;
  float local_444;
  Vec3 local_438;
  TextureFormat local_428;
  float local_420;
  Vec3 local_418;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  Vec4 local_3f8;
  float local_3e8 [8];
  float local_3c8 [8];
  float local_3a8 [6];
  PixelBufferAccess *local_390;
  ReferenceParams *local_388;
  ulong local_380;
  Vec3 local_378;
  undefined1 local_368 [16];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_358;
  undefined1 local_338 [12];
  float fStack_32c;
  undefined1 local_328 [12];
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  ConstPixelBufferAccess *local_2a8;
  Sampler *local_2a0;
  ulong local_298;
  tcu local_290 [8];
  Vec3 local_288;
  float local_278 [4];
  undefined8 local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  float local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  TextureCubeArrayView local_1e8;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined4 local_198;
  float fStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  TextureCubeArrayView local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = sampleParams->baseLevel;
  iVar12 = sampleParams->maxLevel;
  iVar14 = baseView->m_numLevels + -1;
  iVar18 = iVar14;
  if (iVar13 < iVar14) {
    iVar18 = iVar13;
  }
  iVar15 = 0;
  if (-1 < iVar13) {
    iVar15 = iVar18;
  }
  if (iVar12 < iVar14) {
    iVar14 = iVar12;
  }
  iVar13 = 1;
  if (iVar15 <= iVar12) {
    iVar13 = (iVar14 - iVar15) + 1;
  }
  local_390 = errorMask;
  local_2a8 = reference;
  tcu::TextureCubeArrayView::TextureCubeArrayView(&local_78,iVar13,baseView->m_levels + iVar15);
  local_458 = (undefined1  [4])local_78.m_numLevels;
  local_450 = local_78.m_levels;
  local_2a0 = &sampleParams->sampler;
  TVar78 = tcu::getEffectiveTextureView((TextureCubeArrayView *)local_458,&local_358,local_2a0);
  local_1e8.m_levels = TVar78.m_levels;
  local_1e8.m_numLevels = TVar78.m_numLevels;
  local_458 = (undefined1  [4])*texCoord;
  local_3a8[0] = texCoord[1];
  local_454 = texCoord[4];
  local_448 = texCoord[8];
  local_3a8[1] = texCoord[5];
  local_3a8[2] = texCoord[9];
  local_3a8[3] = texCoord[0xd];
  local_3c8[0] = texCoord[2];
  local_468._0_4_ = local_3c8[0];
  local_3c8[1] = texCoord[6];
  local_3c8[2] = texCoord[10];
  local_3c8[3] = texCoord[0xe];
  local_3e8[0] = texCoord[3];
  local_3e8[1] = texCoord[7];
  local_3e8[2] = texCoord[0xb];
  local_3e8[3] = texCoord[0xf];
  if (local_1e8.m_numLevels < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = ((local_1e8.m_levels)->m_size).m_data[0];
  }
  _fStack_470 = 0;
  local_478 = (undefined1  [8])*(ulong *)(result->m_size).m_data;
  local_450 = (ConstPixelBufferAccess *)CONCAT44(texCoord[0xc],local_448);
  local_278[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_278[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_278[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_278[3] = (sampleParams->super_RenderParams).w.m_data[3];
  local_268 = CONCAT44(local_278[1],local_278[2]);
  local_368 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_368 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_78.m_numLevels = -0x40800000;
  local_78._4_4_ = 0;
  local_78.m_levels = (ConstPixelBufferAccess *)0x3f800000;
  local_68 = 0xbf80000000000000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0xbf800000bf800000;
  uStack_50 = 0x3f800000bf800000;
  local_48 = 0xbf8000003f800000;
  uStack_40 = 0x3f8000003f800000;
  local_498._0_4_ = -1.7146522e+38;
  local_444 = local_454;
  local_3e8[4] = local_3e8[2];
  local_3e8[5] = local_3e8[1];
  local_3c8[4] = local_3c8[2];
  local_3c8[5] = local_3c8[1];
  local_3a8[4] = local_3a8[2];
  local_3a8[5] = local_3a8[1];
  tcu::RGBA::toVec((RGBA *)local_498);
  tcu::clear(local_390,&local_3f8);
  if ((result->m_size).m_data[1] < 1) {
    local_498._16_8_ = 0;
  }
  else {
    local_408 = (float)(int)local_478._0_4_;
    fStack_404 = (float)(int)local_478._4_4_;
    fStack_400 = (float)(int)fStack_470;
    fStack_3fc = (float)(int)fStack_46c;
    local_368._4_4_ = local_368._0_4_;
    local_368._8_4_ = local_368._0_4_;
    local_368._12_4_ = local_368._0_4_;
    local_498._16_8_ = 0;
    iVar12 = 0;
    local_498._24_8_ = result;
    local_388 = sampleParams;
    local_2f8 = fStack_404;
    fStack_2f4 = fStack_404;
    fStack_2f0 = fStack_404;
    fStack_2ec = fStack_404;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < ((IVec3 *)(local_498._24_8_ + 8))->m_data[0]) {
        fVar31 = (float)iVar12 + 0.5;
        local_248 = ZEXT416((uint)fVar31);
        local_258 = ZEXT416((uint)(fVar31 / local_2f8));
        local_1c8 = local_2f8 - fVar31;
        fStack_1c4 = fStack_2f4;
        fStack_1c0 = fStack_2f0;
        fStack_1bc = fStack_2ec;
        local_1d8 = ZEXT416((uint)(1.0 - fVar31 / local_2f8));
        iVar18 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_498,(int)local_498._24_8_,iVar18,iVar12);
          pRVar10 = local_388;
          auVar24._0_4_ =
               (float)local_498._0_4_ - (local_388->super_RenderParams).colorBias.m_data[0];
          auVar24._4_4_ =
               (float)local_498._4_4_ - (local_388->super_RenderParams).colorBias.m_data[1];
          auVar24._8_4_ =
               (float)local_498._8_4_ - (local_388->super_RenderParams).colorBias.m_data[2];
          auVar24._12_4_ =
               (float)local_498._12_4_ - (local_388->super_RenderParams).colorBias.m_data[3];
          local_3f8.m_data =
               (float  [4])
               divps(auVar24,*(undefined1 (*) [16])(local_388->super_RenderParams).colorScale.m_data
                    );
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_498,(int)local_2a8,iVar18,iVar12);
          auVar25._0_4_ = (float)local_498._0_4_ - (pRVar10->super_RenderParams).colorBias.m_data[0]
          ;
          auVar25._4_4_ = (float)local_498._4_4_ - (pRVar10->super_RenderParams).colorBias.m_data[1]
          ;
          auVar25._8_4_ = (float)local_498._8_4_ - (pRVar10->super_RenderParams).colorBias.m_data[2]
          ;
          auVar25._12_4_ =
               (float)local_498._12_4_ - (pRVar10->super_RenderParams).colorBias.m_data[3];
          auVar24 = divps(auVar25,*(undefined1 (*) [16])
                                   (pRVar10->super_RenderParams).colorScale.m_data);
          auVar33._0_4_ = local_3f8.m_data[0] - auVar24._0_4_;
          auVar33._4_4_ = local_3f8.m_data[1] - auVar24._4_4_;
          auVar33._8_4_ = local_3f8.m_data[2] - auVar24._8_4_;
          auVar33._12_4_ = local_3f8.m_data[3] - auVar24._12_4_;
          uVar17 = CONCAT44(auVar33._4_4_,auVar33._0_4_);
          auVar69._0_8_ = uVar17 ^ 0x8000000080000000;
          auVar69._8_4_ = -auVar33._8_4_;
          auVar69._12_4_ = -auVar33._12_4_;
          auVar25 = maxps(auVar69,auVar33);
          auVar24 = *(undefined1 (*) [16])(lookupPrec->colorThreshold).m_data;
          auVar26._4_4_ = -(uint)(auVar25._4_4_ <= auVar24._4_4_);
          auVar26._0_4_ = -(uint)(auVar25._0_4_ <= auVar24._0_4_);
          auVar26._8_4_ = -(uint)(auVar25._8_4_ <= auVar24._8_4_);
          auVar26._12_4_ = -(uint)(auVar25._12_4_ <= auVar24._12_4_);
          auVar24 = packssdw(auVar26,auVar26);
          auVar24 = packsswb(auVar24,auVar24);
          local_498._0_4_ = SUB164(auVar24 & _DAT_00639710,0);
          if (SUB161(auVar24 & _DAT_00639710,0) == '\0') {
LAB_005049ab:
            fVar31 = (float)iVar18 + 0.5;
            local_228 = ZEXT416((uint)fVar31);
            fVar21 = fVar31 / local_408;
            fVar22 = (float)local_258._0_4_ + fVar21 + -0.05882353;
            local_238 = (float)local_258._0_4_ + fVar21 + 0.05882353;
            uStack_234 = local_258._4_4_;
            uStack_230 = local_258._8_4_;
            uStack_22c = local_258._12_4_;
            if ((fVar22 <= 1.0) || (1.0 <= local_238)) {
              uVar17 = (ulong)(1.0 < fVar22);
              local_1a8 = local_408 - fVar31;
              fStack_1a4 = local_1c8;
              fStack_1a0 = fStack_404;
              fStack_19c = fStack_1c4;
              fStack_194 = 1.0 - fVar21;
              uStack_1b4 = local_248._0_4_;
              uStack_1b0 = 0;
              uStack_1ac = local_248._4_4_;
              local_188 = (float)local_258._0_4_;
              uStack_180 = local_258._8_4_;
              uStack_17c = local_258._12_4_;
              local_198 = local_1d8._0_4_;
              uStack_190 = local_1d8._8_4_;
              uStack_18c = local_1d8._12_4_;
              local_1b8 = fVar31;
              fStack_184 = fVar21;
              do {
                local_2e8._0_4_ = (int)((uint)(uVar17 == 0) << 0x1f) >> 0x1f;
                local_2e8._4_4_ = (int)((uint)(uVar17 == 0) << 0x1f) >> 0x1f;
                register0x00001288 = 0;
                local_208 = *(ulong *)(local_278 + uVar17 * 3);
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)(local_278 + uVar17 * 3 + 1);
                fVar35 = (float)local_208;
                local_308 = (float)(local_208 >> 0x20);
                auVar42._4_4_ = fVar35;
                auVar42._0_4_ = local_308;
                auVar42._8_4_ = local_308;
                auVar42._12_4_ = fVar35;
                auVar8._4_4_ = fStack_194;
                auVar8._0_4_ = local_198;
                auVar8._8_4_ = uStack_190;
                auVar8._12_4_ = uStack_18c;
                auVar9._4_4_ = fStack_184;
                auVar9._0_4_ = local_188;
                auVar9._8_4_ = uStack_180;
                auVar9._12_4_ = uStack_17c;
                auVar24 = auVar9 & _local_2e8 | ~_local_2e8 & auVar8;
                fVar70 = auVar24._0_4_;
                fVar73 = auVar24._4_4_;
                fVar38 = (1.0 - fVar73) - fVar70;
                auVar24 = divps(auVar24,auVar56);
                auVar36._0_4_ = auVar24._4_4_ + fVar38 / fVar35 + auVar24._0_4_;
                fVar31 = local_3a8[uVar17 * 3];
                _local_468 = ZEXT416((uint)fVar31);
                fVar21 = local_3a8[uVar17 * 3 + 1];
                _local_478 = ZEXT416((uint)fVar21);
                fVar22 = local_3c8[uVar17 * 3];
                local_2b8 = ZEXT416((uint)fVar22);
                fVar74 = local_3c8[uVar17 * 3 + 1];
                local_2c8 = ZEXT416((uint)fVar74);
                fVar75 = local_3c8[uVar17 * 3 + 2];
                local_2d8 = ZEXT416((uint)fVar75);
                fVar76 = (&local_454)[uVar17 * 3];
                _local_328 = ZEXT416((uint)fVar76);
                auVar68._0_4_ = fVar76 * fVar70;
                auVar68._4_4_ = fVar31 * fVar38;
                auVar68._8_4_ = fVar74 * fVar70;
                auVar68._12_4_ = local_3e8[uVar17 * 3] * fVar38;
                fVar77 = *(float *)(local_458 + uVar17 * 0xc);
                _local_338 = ZEXT416((uint)fVar77);
                auVar69 = divps(auVar68,auVar42);
                auVar57._0_4_ = fVar77 * fVar38;
                auVar57._4_4_ = fVar21 * fVar70;
                auVar57._8_4_ = fVar22 * fVar38;
                auVar57._12_4_ = local_3e8[uVar17 * 3 + 1] * fVar70;
                auVar39._8_8_ = local_208;
                auVar39._0_8_ = local_208;
                auVar25 = divps(auVar57,auVar39);
                fVar38 = *(float *)((long)&local_450 + uVar17 * 0xc);
                fVar32 = local_3a8[uVar17 * 3 + 2];
                fStack_30c = local_278[uVar17 * 3 + 2];
                auVar43._0_4_ = fVar38 * fVar73;
                auVar43._4_4_ = fVar32 * fVar73;
                auVar43._8_4_ = fVar75 * fVar73;
                auVar43._12_4_ = local_3e8[uVar17 * 3 + 2] * fVar73;
                local_1f8._4_4_ = fStack_30c;
                local_1f8._0_4_ = fStack_30c;
                local_1f8._8_4_ = fStack_30c;
                local_1f8._12_4_ = fStack_30c;
                auVar24 = divps(auVar43,local_1f8);
                auVar44._0_4_ = auVar24._0_4_ + auVar25._0_4_ + auVar69._0_4_;
                auVar44._4_4_ = auVar24._4_4_ + auVar25._4_4_ + auVar69._4_4_;
                auVar44._8_4_ = auVar24._8_4_ + auVar25._8_4_ + auVar69._8_4_;
                auVar44._12_4_ = auVar24._12_4_ + auVar25._12_4_ + auVar69._12_4_;
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                afVar45 = (float  [4])divps(auVar44,auVar36);
                auVar4._4_4_ = fStack_404;
                auVar4._0_4_ = local_408;
                auVar4._8_4_ = fStack_400;
                auVar4._12_4_ = fStack_3fc;
                local_98 = ZEXT416((uint)(fStack_30c * local_408));
                local_a8 = local_308 * fStack_30c;
                fVar41 = fVar70 + -1.0;
                fVar55 = (local_408 * fVar41 + (float)local_228._0_4_) * local_a8 -
                         (fStack_30c * local_408 * fVar70 + (float)local_228._0_4_ * local_308) *
                         fVar35;
                local_b8 = (fVar76 - fVar77) * fStack_30c + (fVar38 - fVar76) * fVar35;
                fStack_b4 = (fVar21 - fVar31) * fStack_30c + (fVar32 - fVar21) * fVar35;
                fStack_b0 = fStack_30c * 0.0 + fVar35 * 0.0;
                fStack_ac = fStack_30c * 0.0 + fVar35 * 0.0;
                local_c8 = (fVar74 - fVar22) * fStack_30c + (fVar75 - fVar74) * fVar35;
                local_d8 = (fVar22 - fVar75) * local_308;
                uStack_c4 = 0;
                uStack_c0 = 0;
                uStack_bc = 0;
                uStack_d4 = 0;
                uStack_d0 = 0;
                uStack_cc = 0;
                local_e8 = (fVar77 - fVar38) * local_308;
                fStack_e4 = (fVar31 - fVar32) * local_308;
                fStack_e0 = local_308 * 0.0;
                fStack_dc = local_308 * 0.0;
                fVar23 = fVar35 * local_308 * fStack_30c;
                local_108._0_4_ = fVar23 * local_408;
                local_108._4_4_ = local_308;
                local_108._8_8_ = 0;
                auVar58._0_4_ = fVar55 * fVar55;
                auVar58._4_12_ = auVar4._4_12_;
                local_418.m_data[2] =
                     ((local_d8 * fVar41 + fVar70 * local_c8) * (float)local_108._0_4_) /
                     auVar58._0_4_;
                auVar46._0_4_ = (fVar41 * local_e8 + fVar70 * local_b8) * (float)local_108._0_4_;
                auVar46._4_4_ = (fVar41 * fStack_e4 + fVar70 * fStack_b4) * (float)local_108._0_4_;
                auVar46._8_4_ = (fVar73 * fStack_e0 + fVar70 * fStack_b0) * (float)local_108._0_4_;
                auVar46._12_4_ = (fVar73 * fStack_dc + fVar70 * fStack_ac) * (float)local_108._0_4_;
                auVar60._0_8_ = auVar58._0_8_;
                auVar60._8_4_ = fStack_404;
                auVar60._12_4_ = fStack_404;
                auVar59._8_8_ = auVar60._8_8_;
                auVar59._4_4_ = auVar58._0_4_;
                auVar59._0_4_ = auVar58._0_4_;
                auVar24 = divps(auVar46,auVar59);
                local_418.m_data._0_8_ = auVar24._0_8_;
                auVar6._4_4_ = fStack_2f4;
                auVar6._0_4_ = local_2f8;
                auVar6._8_4_ = fStack_2f0;
                auVar6._12_4_ = fStack_2ec;
                local_128 = local_308 * local_2f8;
                fVar41 = fVar73 + -1.0;
                auVar47._4_12_ = auVar6._4_12_;
                fVar55 = (local_2f8 * fVar41 + (float)local_248._0_4_) * local_a8 -
                         (local_128 * fVar73 + (float)local_248._0_4_ * fStack_30c) * fVar35;
                local_88 = CONCAT44(fVar32,fVar38);
                uStack_80 = 0;
                local_138 = (fVar76 - fVar38) * fVar35 + (fVar38 - fVar77) * local_308;
                fStack_134 = (fVar21 - fVar32) * fVar35 + (fVar32 - fVar31) * local_308;
                fStack_130 = fVar35 * 0.0 + local_308 * 0.0;
                fStack_12c = fVar35 * 0.0 + local_308 * 0.0;
                uStack_200 = 0;
                local_148 = (fVar74 - fVar75) * fVar35 + (fVar75 - fVar22) * local_308;
                local_218 = ZEXT416((uint)fStack_30c);
                local_158 = (fVar22 - fVar74) * fStack_30c;
                uStack_144 = 0;
                uStack_140 = 0;
                uStack_13c = 0;
                uStack_154 = 0;
                uStack_150 = 0;
                uStack_14c = 0;
                local_318 = (fVar77 - fVar76) * fStack_30c;
                fStack_314 = (fVar31 - fVar21) * fStack_30c;
                fStack_310 = fStack_30c * 0.0;
                fStack_30c = fStack_30c * 0.0;
                local_f8._0_4_ = fVar23 * local_2f8;
                local_f8._4_8_ = local_208 >> 0x20;
                local_f8._12_4_ = 0;
                auVar47._0_4_ = fVar55 * fVar55;
                local_288.m_data[2] =
                     ((local_158 * fVar41 + fVar73 * local_148) * (float)local_f8._0_4_) /
                     auVar47._0_4_;
                auVar34._0_4_ = (fVar41 * local_318 + fVar73 * local_138) * (float)local_f8._0_4_;
                auVar34._4_4_ = (fVar41 * fStack_314 + fVar73 * fStack_134) * (float)local_f8._0_4_;
                auVar34._8_4_ = (fVar73 * fStack_310 + fVar73 * fStack_130) * (float)local_f8._0_4_;
                auVar34._12_4_ = (fVar73 * fStack_30c + fVar73 * fStack_12c) * (float)local_f8._0_4_
                ;
                auVar49._0_8_ = auVar47._0_8_;
                auVar49._8_4_ = fStack_2f4;
                auVar49._12_4_ = fStack_2f4;
                auVar48._8_8_ = auVar49._8_8_;
                auVar48._4_4_ = auVar47._0_4_;
                auVar48._0_4_ = auVar47._0_4_;
                auVar24 = divps(auVar34,auVar48);
                local_288.m_data._0_8_ = auVar24._0_8_;
                local_498._8_4_ = afVar45[2];
                local_420 = (float)local_498._8_4_;
                local_498._0_8_ = afVar45._0_8_;
                local_428.order = local_498._0_4_;
                local_428.type = local_498._4_4_;
                local_498._0_16_ = (undefined1  [16])afVar45;
                fStack_304 = local_308;
                fStack_300 = local_308;
                fStack_2fc = local_308;
                local_168 = (float)local_f8._0_4_;
                fStack_164 = (float)local_f8._0_4_;
                fStack_160 = (float)local_f8._0_4_;
                fStack_15c = (float)local_f8._0_4_;
                fStack_124 = local_308;
                fStack_120 = local_308;
                fStack_11c = local_308;
                local_118 = (float)local_108._0_4_;
                fStack_114 = (float)local_108._0_4_;
                fStack_110 = (float)local_108._0_4_;
                fStack_10c = (float)local_108._0_4_;
                fStack_a4 = local_308;
                fStack_a0 = local_308;
                fStack_9c = local_308;
                tcu::computeCubeLodBoundsFromDerivates
                          ((tcu *)&local_380,(Vec3 *)&local_428,&local_418,&local_288,iVar13,lodPrec
                          );
                local_2e8._0_4_ =
                     ~local_2e8._0_4_ & (uint)local_1a8 | (uint)local_1b8 & local_2e8._0_4_;
                local_2e8._4_4_ = ~local_2e8._4_4_ & (uint)fStack_1a4 | uStack_1b4 & local_2e8._4_4_
                ;
                fStack_2e0 = (float)(~(uint)fStack_2e0 & (uint)fStack_1a0 |
                                    uStack_1b0 & (uint)fStack_2e0);
                fStack_2dc = (float)(~(uint)fStack_2dc & (uint)fStack_19c |
                                    uStack_1ac & (uint)fStack_2dc);
                local_178 = -(float)local_208;
                uStack_174 = local_208._4_4_ ^ 0x80000000;
                uStack_170 = (uint)uStack_200 ^ 0x80000000;
                uStack_16c = uStack_200._4_4_ ^ 0x80000000;
                fVar31 = (float)local_478._0_4_;
                fVar21 = (float)local_468._0_4_;
                auVar27._4_4_ = (float)local_208;
                auVar27._0_4_ = local_208._4_4_;
                auVar27._8_4_ = (uint)uStack_200;
                auVar27._12_4_ = uStack_200._4_4_;
                auVar3._4_8_ = auVar27._8_8_;
                auVar3._0_4_ = local_208._4_4_;
                auVar28._0_8_ = auVar3._0_8_ << 0x20;
                auVar28._8_4_ = (uint)uStack_200;
                auVar28._12_4_ = uStack_200._4_4_;
                auVar29._4_12_ = auVar28._4_12_;
                auVar29._0_4_ = local_218._0_4_;
                lVar16 = 0;
                local_468._4_4_ = local_468._0_4_;
                local_468._0_4_ = local_328._0_4_;
                fStack_460 = (float)local_328._8_4_;
                fStack_45c = fStack_31c;
                local_478._4_4_ = local_478._0_4_;
                local_478._0_4_ = local_338._0_4_;
                fStack_470 = (float)local_338._8_4_;
                fStack_46c = fStack_32c;
                fVar22 = (float)local_328._0_4_;
                fVar74 = (float)local_328._8_4_;
                fVar75 = fStack_31c;
                fVar76 = (float)local_338._0_4_;
                fVar77 = (float)local_338._8_4_;
                fVar38 = fStack_32c;
                fVar32 = (float)local_2e8._0_4_;
                fVar35 = (float)local_2e8._4_4_;
                fVar23 = fStack_2e0;
                fVar41 = fStack_2dc;
                _local_338 = auVar29;
                _local_328 = auVar27;
                local_298 = uVar17;
                do {
                  fVar32 = (float)*(undefined8 *)(&local_78.m_numLevels + lVar16 * 2) + fVar32;
                  fVar35 = (float)((ulong)*(undefined8 *)(&local_78.m_numLevels + lVar16 * 2) >>
                                  0x20) + fVar35;
                  auVar30._4_4_ = fVar35;
                  auVar30._0_4_ = fVar32;
                  auVar30._8_4_ = fVar23 + 0.0;
                  auVar30._12_4_ = fVar41 + 0.0;
                  auVar5._4_4_ = fStack_404;
                  auVar5._0_4_ = local_408;
                  auVar5._8_4_ = fStack_400;
                  auVar5._12_4_ = fStack_3fc;
                  auVar24 = divps(auVar30,auVar5);
                  fVar23 = auVar24._0_4_;
                  fVar41 = auVar24._4_4_;
                  fVar55 = (1.0 - fVar23) - fVar41;
                  auVar24 = divps(auVar24,_local_338);
                  fVar70 = auVar24._4_4_;
                  auVar61._4_4_ = fVar70;
                  auVar61._0_4_ = fVar70;
                  auVar61._8_4_ = fVar70;
                  auVar61._12_4_ = fVar70;
                  auVar62._4_12_ = auVar61._4_12_;
                  auVar62._0_4_ = fVar70 + fVar55 / (float)local_208 + auVar24._0_4_;
                  local_420 = (((float)local_2d8._0_4_ * fVar23) / (float)local_218._0_4_ +
                              ((float)local_2c8._0_4_ * fVar41) / local_308 +
                              ((float)local_2b8._0_4_ * fVar55) / (float)local_208) / auVar62._0_4_;
                  auVar37._0_4_ = fVar41 * fVar22;
                  auVar37._4_4_ = fVar55 * fVar21;
                  auVar37._8_4_ = fVar41 * fVar74;
                  auVar37._12_4_ = fVar41 * fVar75;
                  auVar24 = divps(auVar37,_local_328);
                  auVar50._0_4_ = fVar55 * fVar76;
                  auVar50._4_4_ = fVar41 * fVar31;
                  auVar50._8_4_ = fVar41 * fVar77;
                  auVar50._12_4_ = fVar41 * fVar38;
                  auVar2._4_4_ = local_208._4_4_;
                  auVar2._0_4_ = (float)local_208;
                  auVar2._8_4_ = (uint)uStack_200;
                  auVar2._12_4_ = uStack_200._4_4_;
                  auVar25 = divps(auVar50,auVar2);
                  auVar71._0_4_ = (float)local_88 * fVar23;
                  auVar71._4_4_ = local_88._4_4_ * fVar23;
                  auVar71._8_4_ = (float)uStack_80 * fVar23;
                  auVar71._12_4_ = uStack_80._4_4_ * fVar23;
                  auVar69 = divps(auVar71,local_1f8);
                  auVar72._0_4_ = auVar69._0_4_ + auVar25._0_4_ + auVar24._0_4_;
                  auVar72._4_4_ = auVar69._4_4_ + auVar25._4_4_ + auVar24._4_4_;
                  auVar72._8_4_ = auVar69._8_4_ + auVar25._8_4_ + auVar24._8_4_;
                  auVar72._12_4_ = auVar69._12_4_ + auVar25._12_4_ + auVar24._12_4_;
                  auVar64._0_8_ = auVar62._0_8_;
                  auVar64._8_4_ = fVar70;
                  auVar64._12_4_ = fVar70;
                  auVar63._8_8_ = auVar64._8_8_;
                  auVar63._4_4_ = auVar62._0_4_;
                  auVar63._0_4_ = auVar62._0_4_;
                  auVar24 = divps(auVar72,auVar63);
                  local_428 = auVar24._0_8_;
                  fVar31 = fVar41 + -1.0;
                  auVar65._4_12_ = auVar5._4_12_;
                  fVar21 = (local_408 * fVar31 + fVar32) * local_a8 +
                           ((float)local_98._0_4_ * fVar41 + local_308 * fVar32) * local_178;
                  auVar65._0_4_ = fVar21 * fVar21;
                  local_438.m_data[2] =
                       ((local_d8 * fVar31 + local_c8 * fVar41) * (float)local_108._0_4_) /
                       auVar65._0_4_;
                  auVar51._0_4_ = (fVar31 * local_e8 + fVar41 * local_b8) * local_118;
                  auVar51._4_4_ = (fVar31 * fStack_e4 + fVar41 * fStack_b4) * fStack_114;
                  auVar51._8_4_ = (fVar41 * fStack_e0 + fVar41 * fStack_b0) * fStack_110;
                  auVar51._12_4_ = (fVar41 * fStack_dc + fVar41 * fStack_ac) * fStack_10c;
                  auVar67._0_8_ = auVar65._0_8_;
                  auVar67._8_4_ = fStack_404;
                  auVar67._12_4_ = fStack_404;
                  auVar66._8_8_ = auVar67._8_8_;
                  auVar66._4_4_ = auVar65._0_4_;
                  auVar66._0_4_ = auVar65._0_4_;
                  auVar24 = divps(auVar51,auVar66);
                  local_438.m_data._0_8_ = auVar24._0_8_;
                  fVar31 = fVar23 + -1.0;
                  auVar7._4_4_ = fStack_2f4;
                  auVar7._0_4_ = local_2f8;
                  auVar7._8_4_ = fStack_2f0;
                  auVar7._12_4_ = fStack_2ec;
                  auVar52._4_12_ = auVar7._4_12_;
                  fVar21 = (local_2f8 * fVar31 + fVar35) * local_a8 +
                           (local_128 * fVar23 + fVar35 * (float)local_218._0_4_) * local_178;
                  auVar52._0_4_ = fVar21 * fVar21;
                  local_378.m_data[2] =
                       ((local_158 * fVar31 + fVar23 * local_148) * (float)local_f8._0_4_) /
                       auVar52._0_4_;
                  auVar40._0_4_ = (fVar31 * local_318 + fVar23 * local_138) * local_168;
                  auVar40._4_4_ = (fVar31 * fStack_314 + fVar23 * fStack_134) * fStack_164;
                  auVar40._8_4_ = (fVar41 * fStack_310 + fVar23 * fStack_130) * fStack_160;
                  auVar40._12_4_ = (fVar41 * fStack_30c + fVar23 * fStack_12c) * fStack_15c;
                  auVar54._0_8_ = auVar52._0_8_;
                  auVar54._8_4_ = fStack_2f4;
                  auVar54._12_4_ = fStack_2f4;
                  auVar53._8_8_ = auVar54._8_8_;
                  auVar53._4_4_ = auVar52._0_4_;
                  auVar53._0_4_ = auVar52._0_4_;
                  auVar24 = divps(auVar40,auVar53);
                  local_378.m_data._0_8_ = auVar24._0_8_;
                  tcu::computeCubeLodBoundsFromDerivates
                            (local_290,(Vec3 *)&local_428,&local_438,&local_378,iVar13,lodPrec);
                  fVar31 = (float)(local_380 >> 0x20);
                  uVar19 = -(uint)((float)local_380 <= local_290._0_4_);
                  uVar20 = -(uint)(local_290._4_4_ <= fVar31);
                  local_380 = CONCAT44(~uVar20 & (uint)local_290._4_4_,
                                       ~uVar19 & (uint)local_290._0_4_) |
                              CONCAT44((uint)fVar31 & uVar20,(uint)(float)local_380 & uVar19);
                  lVar16 = lVar16 + 1;
                  fVar22 = (float)local_468._0_4_;
                  fVar21 = (float)local_468._4_4_;
                  fVar74 = fStack_460;
                  fVar75 = fStack_45c;
                  fVar76 = (float)local_478._0_4_;
                  fVar31 = (float)local_478._4_4_;
                  fVar77 = fStack_470;
                  fVar38 = fStack_46c;
                  fVar32 = (float)local_2e8._0_4_;
                  fVar35 = (float)local_2e8._4_4_;
                  fVar23 = fStack_2e0;
                  fVar41 = fStack_2dc;
                } while (lVar16 != 8);
                local_438.m_data[0] = (float)local_380 + (float)local_368._0_4_;
                local_438.m_data[1] = (float)(local_380 >> 0x20) + (float)local_368._4_4_;
                local_378.m_data[0] = local_388->minLod;
                local_378.m_data[1] = local_388->maxLod;
                tcu::clampLodBounds((tcu *)&local_428,(Vec2 *)&local_438,(Vec2 *)&local_378,lodPrec)
                ;
                bVar11 = tcu::isLookupResultValid
                                   (&local_1e8,local_2a0,lookupPrec,coordBits,(Vec4 *)local_498,
                                    (Vec2 *)&local_428,&local_3f8);
                if (bVar11) goto LAB_00504a60;
              } while ((local_298 == 0) && (uVar17 = 1, 1.0 <= local_238));
            }
            local_418.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_418);
            tcu::PixelBufferAccess::setPixel(local_390,(Vec4 *)local_498,iVar18,iVar12,0);
            local_498._16_8_ = ZEXT48((int)local_498._16_8_ + 1);
          }
          else {
            uVar17 = 0xffffffffffffffff;
            do {
              if (uVar17 == 2) goto LAB_00504a60;
              uVar1 = uVar17 + 1;
              lVar16 = uVar17 + 2;
              uVar17 = uVar1;
            } while (local_498[lVar16] != '\0');
            if (uVar1 < 3) goto LAB_005049ab;
          }
LAB_00504a60:
          iVar18 = iVar18 + 1;
        } while (iVar18 < ((IVec3 *)(local_498._24_8_ + 8))->m_data[0]);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < ((IVec3 *)(local_498._24_8_ + 8))->m_data[1]);
  }
  if (local_358.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_498._16_8_;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::IVec4&						coordBits,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeArrayView				src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	const tcu::Vec4								qq					= tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triQ[2]				= { qq.swizzle(0, 1, 2), qq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float((1<<4) + 1); // ES3 requires at least 4 subpixel bits.

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= nx + ny - posEps <= 1.0f;
				const bool		tri1	= nx + ny + posEps >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx		= triNdx ? dstW - wx : wx;
					const float		triWy		= triNdx ? dstH - wy : wy;
					const float		triNx		= triNdx ? 1.0f - nx : nx;
					const float		triNy		= triNdx ? 1.0f - ny : ny;

					const tcu::Vec4	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triQ[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord.toWidth<3>(), coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo			= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo			= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo			= wxo/dstW;
						const float		nyo			= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coordBits, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}